

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

Scaler * __thiscall CoreML::Specification::Model::mutable_scaler(Model *this)

{
  bool bVar1;
  Scaler *this_00;
  Model *this_local;
  
  bVar1 = has_scaler(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_scaler(this);
    this_00 = (Scaler *)operator_new(0x40);
    Scaler::Scaler(this_00);
    (this->Type_).scaler_ = this_00;
  }
  return (Scaler *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::Scaler* Model::mutable_scaler() {
  if (!has_scaler()) {
    clear_Type();
    set_has_scaler();
    Type_.scaler_ = new ::CoreML::Specification::Scaler;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.scaler)
  return Type_.scaler_;
}